

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_sqrt_sort_merge_down(int **arr,int **arr2,int L1,int L2)

{
  int M;
  int p1;
  int p0;
  int L2_local;
  int L1_local;
  int **arr2_local;
  int **arr_local;
  
  p0 = 0;
  p1 = 0;
  M = -L2;
  while (p1 < L2) {
    if ((p0 == L1) || (-1 < *arr[p0] - *arr2[p1])) {
      arr[M] = arr2[p1];
      p1 = p1 + 1;
    }
    else {
      arr[M] = arr[p0];
      p0 = p0 + 1;
    }
    M = M + 1;
  }
  if (M != p0) {
    while (p0 < L1) {
      arr[M] = arr[p0];
      M = M + 1;
      p0 = p0 + 1;
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_MERGE_DOWN(SORT_TYPE *arr, SORT_TYPE *arr2, int L1,
                                 int L2) {
  int p0 = 0, p1 = 0, M = -L2;

  while (p1 < L2) {
    if (p0 == L1 || SORT_CMP_A(arr + p0, arr2 + p1) >= 0) {
      arr[M++] = arr2[p1++];
    } else {
      arr[M++] = arr[p0++];
    }
  }

  if (M != p0)
    while (p0 < L1) {
      arr[M++] = arr[p0++];
    }
}